

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O3

void __thiscall
spvtools::opt::IRContext::KillOperandFromDebugInstructions(IRContext *this,Instruction *inst)

{
  Op opcode;
  Module *pMVar1;
  pointer pOVar2;
  uint32_t uVar3;
  OpenCLDebugInfo100Instructions OVar4;
  uint32_t uVar5;
  int32_t iVar6;
  CommonDebugInfoInstructions CVar7;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var8;
  Instruction *pIVar9;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var10;
  Instruction *pIVar11;
  
  opcode = inst->opcode_;
  uVar3 = 0;
  if (inst->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  if (opcode != OpVariable) {
    if ((opcode == OpFunction) &&
       (pMVar1 = (this->module_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
       pIVar11 = *(Instruction **)
                  ((long)&(pMVar1->ext_inst_debuginfo_).
                          super_IntrusiveList<spvtools::opt::Instruction> + 0x10),
       pIVar11 !=
       (Instruction *)
       ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)))
    {
      do {
        OVar4 = Instruction::GetOpenCL100DebugOpcode(pIVar11);
        if (OVar4 == OpenCLDebugInfo100DebugFunction) {
          pOVar2 = (pIVar11->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(pIVar11->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
                     -0x5555555555555555) < 0xe) goto LAB_00591d84;
          _Var8._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = pOVar2[0xd].words.large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t;
          _Var10._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )&pOVar2[0xd].words.small_data_;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )_Var8._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            _Var8._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 _Var10._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl;
          }
          if (**(uint32_t **)
                _Var8._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl == uVar3) {
            if ((this->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
              BuildDebugInfoManager(this);
            }
            pIVar9 = analysis::DebugInfoManager::GetDebugInfoNone
                               ((this->debug_info_mgr_)._M_t.
                                super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                                ._M_head_impl);
            uVar5 = 0;
            if (pIVar9->has_result_id_ == true) {
              uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
            }
            _Var8._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 pOVar2[0xd].words.large_data_._M_t.
                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_t;
            if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )_Var8._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              _Var10._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl =
                   _Var8._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl;
            }
            **(uint32_t **)
              _Var10._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl = uVar5;
            if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              BuildDefUseManager(this);
            }
            analysis::DefUseManager::AnalyzeInstUse
                      ((this->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,pIVar11);
          }
        }
        pIVar11 = (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (pIVar11 !=
               (Instruction *)
               ((long)&(((this->module_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                       ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> + 8U));
    }
    iVar6 = spvOpcodeIsConstant(opcode);
    if (iVar6 == 0) {
      return;
    }
  }
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar11 = *(Instruction **)
             ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  if (pIVar11 !=
      (Instruction *)
      ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    do {
      CVar7 = Instruction::GetCommonDebugOpcode(pIVar11);
      if (CVar7 == CommonDebugInfoDebugGlobalVariable) {
        pOVar2 = (pIVar11->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(pIVar11->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
                   -0x5555555555555555) < 0xc) {
LAB_00591d84:
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
        }
        _Var8._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = pOVar2[0xb].words.large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t;
        _Var10._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )&pOVar2[0xb].words.small_data_;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )_Var8._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          _Var8._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = _Var10._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
        }
        if (**(uint32_t **)
              _Var8._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl == uVar3) {
          if ((this->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
            BuildDebugInfoManager(this);
          }
          pIVar9 = analysis::DebugInfoManager::GetDebugInfoNone
                             ((this->debug_info_mgr_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                              .
                              super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                              ._M_head_impl);
          uVar5 = 0;
          if (pIVar9->has_result_id_ == true) {
            uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
          }
          _Var8._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = pOVar2[0xb].words.large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )_Var8._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            _Var10._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 _Var8._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl;
          }
          **(uint32_t **)
            _Var10._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl = uVar5;
          if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            BuildDefUseManager(this);
          }
          analysis::DefUseManager::AnalyzeInstUse
                    ((this->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,pIVar11);
        }
      }
      pIVar11 = (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar11 !=
             (Instruction *)
             ((long)&(((this->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                     ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> + 8U));
  }
  return;
}

Assistant:

void IRContext::KillOperandFromDebugInstructions(Instruction* inst) {
  const auto opcode = inst->opcode();
  const uint32_t id = inst->result_id();
  // Kill id of OpFunction from DebugFunction.
  if (opcode == spv::Op::OpFunction) {
    for (auto it = module()->ext_inst_debuginfo_begin();
         it != module()->ext_inst_debuginfo_end(); ++it) {
      if (it->GetOpenCL100DebugOpcode() != OpenCLDebugInfo100DebugFunction)
        continue;
      auto& operand = it->GetOperand(kDebugFunctionOperandFunctionIndex);
      if (operand.words[0] == id) {
        operand.words[0] =
            get_debug_info_mgr()->GetDebugInfoNone()->result_id();
        get_def_use_mgr()->AnalyzeInstUse(&*it);
      }
    }
  }
  // Kill id of OpVariable for global variable from DebugGlobalVariable.
  if (opcode == spv::Op::OpVariable || IsConstantInst(opcode)) {
    for (auto it = module()->ext_inst_debuginfo_begin();
         it != module()->ext_inst_debuginfo_end(); ++it) {
      if (it->GetCommonDebugOpcode() != CommonDebugInfoDebugGlobalVariable)
        continue;
      auto& operand = it->GetOperand(kDebugGlobalVariableOperandVariableIndex);
      if (operand.words[0] == id) {
        operand.words[0] =
            get_debug_info_mgr()->GetDebugInfoNone()->result_id();
        get_def_use_mgr()->AnalyzeInstUse(&*it);
      }
    }
  }
}